

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_number_toPrecision(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue val;
  JSValue JVar6;
  JSValue JVar7;
  JSValue val_00;
  int p;
  double d;
  
  JVar6 = js_thisNumberValue(ctx,this_val);
  if ((int)JVar6.tag == 6) {
    JVar2.float64 = -NAN;
    JVar5 = JVar6.u;
  }
  else {
    iVar1 = JS_ToFloat64Free(ctx,&d,JVar6);
    iVar4 = 6;
    if (iVar1 != 0) {
LAB_0015789b:
      JVar5.float64 = 0.0;
      uVar3 = 0;
      goto LAB_0015789d;
    }
    if ((int)argv->tag == 3) {
LAB_001578c1:
      val.tag = 7;
      val.u.float64 = d;
      JVar6 = JS_ToStringFree(ctx,val);
    }
    else {
      val_00.tag = argv->tag;
      val_00.u.ptr = (argv->u).ptr;
      iVar1 = JS_ToInt32Sat(ctx,&p,val_00);
      if (iVar1 != 0) goto LAB_0015789b;
      if (0x7fefffffffffffff < (ulong)ABS(d)) goto LAB_001578c1;
      if (p - 0x65U < 0xffffff9c) {
        JS_ThrowRangeError(ctx,"invalid number of digits");
        goto LAB_0015789b;
      }
      JVar6 = js_dtoa(ctx,d,10,p,1);
    }
    JVar2 = JVar6.u;
    JVar6.tag = JVar6.tag;
    JVar6.u.float64 = -NAN;
    JVar5 = JVar2;
  }
  iVar4 = JVar6.tag;
  uVar3 = (ulong)JVar6.u.ptr & (ulong)JVar2.ptr;
LAB_0015789d:
  JVar7.u.ptr = (void *)((ulong)JVar5.ptr & 0xffffffff | uVar3);
  JVar7.tag = iVar4;
  return JVar7;
}

Assistant:

static JSValue js_number_toPrecision(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val;
    int p;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    if (JS_IsUndefined(argv[0]))
        goto to_string;
    if (JS_ToInt32Sat(ctx, &p, argv[0]))
        return JS_EXCEPTION;
    if (!isfinite(d)) {
    to_string:
        return JS_ToStringFree(ctx,  __JS_NewFloat64(ctx, d));
    }
    if (p < 1 || p > 100)
        return JS_ThrowRangeError(ctx, "invalid number of digits");
    return js_dtoa(ctx, d, 10, p, JS_DTOA_FIXED_FORMAT);
}